

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_lua_generator.cc
# Opt level: O3

void __thiscall
t_lua_generator::generate_process_function
          (t_lua_generator *this,ostream *out,t_service *tservice,t_function *tfunction)

{
  int *piVar1;
  long lVar2;
  pointer pcVar3;
  t_struct *ptVar4;
  int iVar5;
  undefined4 extraout_var;
  ostream *poVar6;
  undefined4 extraout_var_00;
  t_lua_generator *this_00;
  const_iterator x_iter;
  pointer pptVar7;
  string argsname;
  string fn_name;
  string classname;
  string resultname;
  string local_1b8;
  ostream *local_198;
  string local_190;
  string local_170;
  char *local_150;
  long local_148;
  char local_140 [16];
  string local_130;
  char *local_110;
  long local_108;
  char local_100 [16];
  char *local_f0;
  long local_e8;
  char local_e0 [16];
  char *local_d0;
  long local_c8;
  char local_c0 [16];
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_198 = out;
  iVar5 = (*(tservice->super_t_type).super_t_doc._vptr_t_doc[3])(tservice);
  local_f0 = local_e0;
  lVar2 = *(long *)CONCAT44(extraout_var,iVar5);
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f0,lVar2,((long *)CONCAT44(extraout_var,iVar5))[1] + lVar2);
  std::__cxx11::string::append((char *)&local_f0);
  local_150 = local_140;
  pcVar3 = (tfunction->name_)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_150,pcVar3,pcVar3 + (tfunction->name_)._M_string_length);
  std::__cxx11::string::append((char *)&local_150);
  local_d0 = local_c0;
  pcVar3 = (tfunction->name_)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d0,pcVar3,pcVar3 + (tfunction->name_)._M_string_length);
  std::__cxx11::string::append((char *)&local_d0);
  local_110 = local_100;
  pcVar3 = (tfunction->name_)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_110,pcVar3,pcVar3 + (tfunction->name_)._M_string_length);
  poVar6 = t_generator::indent((t_generator *)this,local_198);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"function ",9);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_f0,local_e8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,":process_",9);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_110,local_108);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,"(seqid, iprot, oprot, server_ctx)",0x21);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  t_generator::indent_abi_cxx11_(&local_1b8,(t_generator *)this);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_198,local_1b8._M_dataplus._M_p,local_1b8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"local args = ",0xd);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_150,local_148);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,":new{}",6);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_190,(t_generator *)this);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,local_190._M_dataplus._M_p,local_190._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,"local reply_type = TMessageType.REPLY",0x25);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_170,(t_generator *)this);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,local_170._M_dataplus._M_p,local_170._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"args:read(iprot)",0x10);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_130,(t_generator *)this);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,local_130._M_dataplus._M_p,local_130._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"iprot:readMessageEnd()",0x16);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != &local_170.field_2) {
    operator_delete(local_170._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != &local_190.field_2) {
    operator_delete(local_190._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
    operator_delete(local_1b8._M_dataplus._M_p);
  }
  if (tfunction->oneway_ == false) {
    t_generator::indent_abi_cxx11_(&local_1b8,(t_generator *)this);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_198,local_1b8._M_dataplus._M_p,local_1b8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"local result = ",0xf);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_d0,local_c8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,":new{}",6);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
      operator_delete(local_1b8._M_dataplus._M_p);
    }
  }
  t_generator::indent_abi_cxx11_(&local_1b8,(t_generator *)this);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_198,local_1b8._M_dataplus._M_p,local_1b8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,"local status, res = pcall(self.handler.",0x27);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_110,local_108);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,", self.handler",0xe);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
    operator_delete(local_1b8._M_dataplus._M_p);
  }
  ptVar4 = tfunction->arglist_;
  if ((ptVar4->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (ptVar4->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    std::__ostream_insert<char,std::char_traits<char>>(local_198,", ",2);
    this_00 = (t_lua_generator *)0x39985e;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"args.","");
    argument_list(&local_1b8,this_00,ptVar4,&local_50);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_198,local_1b8._M_dataplus._M_p,local_1b8._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
      operator_delete(local_1b8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
  }
  poVar6 = local_198;
  std::__ostream_insert<char,std::char_traits<char>>(local_198,")",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if (tfunction->oneway_ == false) {
    t_generator::indent_abi_cxx11_(&local_1b8,(t_generator *)this);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_198,local_1b8._M_dataplus._M_p,local_1b8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"if not status then",0x12);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    t_generator::indent_abi_cxx11_(&local_190,(t_generator *)this);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,local_190._M_dataplus._M_p,local_190._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,"  reply_type = TMessageType.EXCEPTION",0x25);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    t_generator::indent_abi_cxx11_(&local_170,(t_generator *)this);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,local_170._M_dataplus._M_p,local_170._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,"  result = TApplicationException:new{message = res}",0x33);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != &local_170.field_2) {
      operator_delete(local_170._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._M_dataplus._M_p != &local_190.field_2) {
      operator_delete(local_190._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
      operator_delete(local_1b8._M_dataplus._M_p);
    }
    ptVar4 = tfunction->xceptions_;
    pptVar7 = (ptVar4->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((ptVar4->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
        super__Vector_impl_data._M_finish != pptVar7) {
      do {
        t_generator::indent_abi_cxx11_(&local_1b8,(t_generator *)this);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (local_198,local_1b8._M_dataplus._M_p,local_1b8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"elseif ttype(res) == \'",0x16);
        iVar5 = (*((*pptVar7)->type_->super_t_doc)._vptr_t_doc[3])();
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar6,*(char **)CONCAT44(extraout_var_00,iVar5),
                            ((undefined8 *)CONCAT44(extraout_var_00,iVar5))[1]);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\' then",6);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,
                            ::endl_abi_cxx11_._M_string_length);
        t_generator::indent_abi_cxx11_(&local_190,(t_generator *)this);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar6,local_190._M_dataplus._M_p,local_190._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"  result.",9);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar6,((*pptVar7)->name_)._M_dataplus._M_p,
                            ((*pptVar7)->name_)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6," = res",6);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_190._M_dataplus._M_p != &local_190.field_2) {
          operator_delete(local_190._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
          operator_delete(local_1b8._M_dataplus._M_p);
        }
        pptVar7 = pptVar7 + 1;
      } while (pptVar7 !=
               (ptVar4->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
               super__Vector_impl_data._M_finish);
    }
    t_generator::indent_abi_cxx11_(&local_1b8,(t_generator *)this);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_198,local_1b8._M_dataplus._M_p,local_1b8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"else",4);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    t_generator::indent_abi_cxx11_(&local_190,(t_generator *)this);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,local_190._M_dataplus._M_p,local_190._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"  result.success = res",0x16);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    t_generator::indent_abi_cxx11_(&local_170,(t_generator *)this);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,local_170._M_dataplus._M_p,local_170._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"end",3);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    t_generator::indent_abi_cxx11_(&local_130,(t_generator *)this);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,local_130._M_dataplus._M_p,local_130._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"oprot:writeMessageBegin(\'",0x19);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_110,local_108);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\', reply_type, ",0xf);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"seqid)",6);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    t_generator::indent_abi_cxx11_(&local_70,(t_generator *)this);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,local_70._M_dataplus._M_p,local_70._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"result:write(oprot)",0x13);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    t_generator::indent_abi_cxx11_(&local_90,(t_generator *)this);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,local_90._M_dataplus._M_p,local_90._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"oprot:writeMessageEnd()",0x17);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    t_generator::indent_abi_cxx11_(&local_b0,(t_generator *)this);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,local_b0._M_dataplus._M_p,local_b0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"oprot.trans:flush()",0x13);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != &local_170.field_2) {
      operator_delete(local_170._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._M_dataplus._M_p != &local_190.field_2) {
      operator_delete(local_190._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
      operator_delete(local_1b8._M_dataplus._M_p);
    }
  }
  t_generator::indent_abi_cxx11_(&local_1b8,(t_generator *)this);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_198,local_1b8._M_dataplus._M_p,local_1b8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"return status, res",0x12);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
    operator_delete(local_1b8._M_dataplus._M_p);
  }
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  poVar6 = t_generator::indent((t_generator *)this,local_198);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"end",3);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if (local_110 != local_100) {
    operator_delete(local_110);
  }
  if (local_d0 != local_c0) {
    operator_delete(local_d0);
  }
  if (local_150 != local_140) {
    operator_delete(local_150);
  }
  if (local_f0 != local_e0) {
    operator_delete(local_f0);
  }
  return;
}

Assistant:

void t_lua_generator::generate_process_function(ostream& out,
                                                t_service* tservice,
                                                t_function* tfunction) {
  string classname = tservice->get_name() + "Processor";
  string argsname = tfunction->get_name() + "_args";
  string resultname = tfunction->get_name() + "_result";
  string fn_name = tfunction->get_name();

  indent(out) << endl << "function " << classname << ":process_" << fn_name
              << "(seqid, iprot, oprot, server_ctx)" << endl;
  indent_up();

  // Read the request
  out << indent() << "local args = " << argsname << ":new{}" << endl << indent()
      << "local reply_type = TMessageType.REPLY" << endl << indent() << "args:read(iprot)" << endl
      << indent() << "iprot:readMessageEnd()" << endl;

  if (!tfunction->is_oneway()) {
      out << indent() << "local result = " << resultname
          << ":new{}" << endl;
  }

  out <<  indent() << "local status, res = pcall(self.handler." << fn_name
      << ", self.handler";
  // Print arguments
  t_struct* args = tfunction->get_arglist();
  if (args->get_members().size() > 0) {
    out << ", " << argument_list(args, "args.");
  }
  out << ")" << endl;

  if (!tfunction->is_oneway()) {
      // Check for errors
      out << indent() << "if not status then" << endl << indent()
          << "  reply_type = TMessageType.EXCEPTION" << endl << indent()
          << "  result = TApplicationException:new{message = res}" << endl;

      // Handle custom exceptions
      const std::vector<t_field*>& xf = tfunction->get_xceptions()->get_members();
      if (xf.size() > 0) {
          vector<t_field*>::const_iterator x_iter;
          for (x_iter = xf.begin(); x_iter != xf.end(); ++x_iter) {
              out << indent() << "elseif ttype(res) == '" << (*x_iter)->get_type()->get_name() << "' then"
                  << endl << indent() << "  result." << (*x_iter)->get_name() << " = res" << endl;
          }
      }

      // Set the result and write the reply
      out << indent() << "else" << endl << indent() << "  result.success = res" << endl << indent()
          << "end" << endl << indent() << "oprot:writeMessageBegin('" << fn_name << "', reply_type, "
          << "seqid)" << endl << indent() << "result:write(oprot)" << endl << indent()
          << "oprot:writeMessageEnd()" << endl << indent() << "oprot.trans:flush()" << endl;
  }
  out << indent() << "return status, res" << endl;
  indent_down();
  indent(out) << "end" << endl;
}